

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall
GdlNumericExpression::GdlNumericExpression(GdlNumericExpression *this,int nValue,int munits)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  GdlSimpleExpression *in_stack_ffffffffffffffe0;
  
  GdlSimpleExpression::GdlSimpleExpression(in_stack_ffffffffffffffe0);
  *in_RDI = (long)&PTR_Clone_0036aeb0;
  *(undefined4 *)((long)in_RDI + 0x34) = in_ESI;
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  *(undefined1 *)((long)in_RDI + 0x3c) = 0;
  if ((int)in_RDI[7] == -1) {
    (**(code **)(*in_RDI + 0x18))(in_RDI,1);
  }
  else {
    (**(code **)(*in_RDI + 0x18))(in_RDI,3);
  }
  return;
}

Assistant:

GdlNumericExpression(int nValue, int munits)
		:	GdlSimpleExpression(),
			m_nValue(nValue),
			m_munits(munits),
			m_fBoolean(false)
	{
		if (m_munits == kmunitNone)
			SetType(kexptNumber);
		else
			SetType(kexptMeas);
	}